

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductRepresentation::~IfcProductRepresentation
          (IfcProductRepresentation *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  
  p_Var1 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
           _vptr_ObjectHelper[-3];
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
           _vptr_ObjectHelper + (long)p_Var1) = &PTR__IfcProductRepresentation_008d9d38;
  *(undefined ***)(&this->field_0x78 + (long)p_Var1) = &PTR__IfcProductRepresentation_008d9d60;
  pvVar2 = *(void **)(p_Var1 + (long)&(this->Representations).
                                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                      .
                                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     );
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(p_Var1 + 0x10 +
                                    (long)&(this->Representations).
                                           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                           .
                                           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                    ) - (long)pvVar2);
  }
  if (*(code **)(p_Var1 + (long)&(this->Description).ptr._M_dataplus) !=
      p_Var1 + 0x10 + (long)&(this->Description).ptr._M_dataplus) {
    operator_delete(*(code **)(p_Var1 + (long)&(this->Description).ptr._M_dataplus),
                    *(long *)(p_Var1 + 0x10 + (long)&(this->Description).ptr._M_dataplus) + 1);
  }
  plVar3 = *(long **)(&(this->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
                       field_0x10 + (long)p_Var1);
  plVar4 = (long *)(&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
                     field_0x20 + (long)p_Var1);
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcProductRepresentation() : Object("IfcProductRepresentation") {}